

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test::
~TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test
          (TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test *this)

{
  TEST_GROUP_CppUTestGroupMockPlugin::~TEST_GROUP_CppUTestGroupMockPlugin
            (&this->super_TEST_GROUP_CppUTestGroupMockPlugin);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST(MockPlugin, checkExpectationsAndClearAtEnd)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(test, expectations);

    mock().expectOneCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    LONGS_EQUAL(0, mock().expectedCallsLeft());
    CHECK_NO_MOCK_FAILURE();
}